

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.hpp
# Opt level: O1

void __thiscall zmq::blob_t::set_deep_copy(blob_t *this,blob_t *other_)

{
  size_t __n;
  uchar *puVar1;
  
  if (this->_owned == true) {
    free(this->_data);
  }
  this->_data = (uchar *)0x0;
  this->_size = 0;
  puVar1 = (uchar *)malloc(other_->_size);
  this->_data = puVar1;
  if (puVar1 == (uchar *)0x0) {
    set_deep_copy();
  }
  __n = other_->_size;
  this->_size = __n;
  this->_owned = true;
  memcpy(this->_data,other_->_data,__n);
  return;
}

Assistant:

void set_deep_copy (blob_t const &other_)
    {
        clear ();
        _data = static_cast<unsigned char *> (malloc (other_._size));
        alloc_assert (_data);
        _size = other_._size;
        _owned = true;
        memcpy (_data, other_._data, _size);
    }